

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegressionTree.cpp
# Opt level: O0

void __thiscall RegressionTree::genDynamicFunctions(RegressionTree *this)

{
  undefined1 uVar1;
  Function *__rhs;
  ostream *poVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  ostream *poVar3;
  Application *in_RDI;
  ofstream ofs;
  Attribute *att;
  size_t var;
  string fvarString;
  var_bitset *fVars;
  Function *func;
  size_t f;
  string functionSource;
  string functionHeaders;
  RegressionTree *in_stack_00001c58;
  size_t in_stack_fffffffffffff8c8;
  QueryCompiler *in_stack_fffffffffffff8d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8d8;
  TreeDecomposition *in_stack_fffffffffffff8e0;
  undefined7 in_stack_fffffffffffff8f0;
  undefined1 in_stack_fffffffffffff8f7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff8f8;
  undefined7 in_stack_fffffffffffff908;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs_00;
  string local_6d8 [32];
  string local_6b8 [32];
  string local_698 [32];
  string local_678 [32];
  string local_658 [32];
  string local_638 [32];
  string local_618 [32];
  string local_5f8 [32];
  ostream local_5d8 [512];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [32];
  string local_378 [32];
  string local_358 [32];
  string local_338 [32];
  string local_318 [32];
  string local_2f8 [32];
  string local_2d8 [32];
  string local_2b8 [32];
  string local_298 [32];
  string local_278 [32];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  Attribute *local_b8;
  ulong local_b0;
  undefined1 local_a1 [33];
  Function *local_80;
  Function *local_78;
  ulong local_70;
  undefined1 local_61 [56];
  allocator local_29;
  string local_28 [40];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"",&local_29);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  __rhs_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_61;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_61 + 1),"",(allocator *)__rhs_00);
  std::allocator<char>::~allocator((allocator<char> *)local_61);
  for (local_70 = 0; local_70 < 0x5dc; local_70 = local_70 + 1) {
    std::vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_>::operator[]
              ((vector<std::bitset<1500UL>,_std::allocator<std::bitset<1500UL>_>_> *)
               &in_RDI[3]._listOfFeatures.super__Vector_base<Feature,_std::allocator<Feature>_>.
                _M_impl.super__Vector_impl_data._M_finish,100);
    uVar1 = std::bitset<1500UL>::test
                      ((bitset<1500UL> *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
    if ((bool)uVar1) {
      std::__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<QueryCompiler,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x227bb5);
      __rhs = QueryCompiler::getFunction(in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
      in_stack_fffffffffffff8f8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a1;
      local_80 = __rhs;
      local_78 = __rhs;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_a1 + 1),"",(allocator *)in_stack_fffffffffffff8f8);
      std::allocator<char>::~allocator((allocator<char> *)local_a1);
      for (local_b0 = 0; local_b0 < 100; local_b0 = local_b0 + 1) {
        in_stack_fffffffffffff8f7 =
             std::bitset<100UL>::test
                       ((bitset<100UL> *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
        if ((bool)in_stack_fffffffffffff8f7) {
          std::__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
          operator->((__shared_ptr_access<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)0x227c77);
          local_b8 = TreeDecomposition::getAttribute
                               (in_stack_fffffffffffff8e0,(size_t)in_stack_fffffffffffff8d8);
          Application::typeToStr_abi_cxx11_(in_RDI,(Type)((ulong)__rhs_00 >> 0x20));
          std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
          std::operator+(in_stack_fffffffffffff8d8,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffff8d0);
          std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
          std::__cxx11::string::operator+=((string *)(local_a1 + 1),local_d8);
          std::__cxx11::string::~string(local_d8);
          std::__cxx11::string::~string(local_f8);
          std::__cxx11::string::~string(local_118);
          std::__cxx11::string::~string(local_138);
        }
      }
      std::__cxx11::string::pop_back();
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(uVar1,in_stack_fffffffffffff908),(size_t)__rhs);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::__cxx11::string::operator+=(local_28,local_158);
      std::__cxx11::string::~string(local_158);
      std::__cxx11::string::~string(local_178);
      std::__cxx11::string::~string(local_198);
      std::__cxx11::string::~string(local_1b8);
      std::__cxx11::string::~string(local_1d8);
      std::__cxx11::string::~string(local_1f8);
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(uVar1,in_stack_fffffffffffff908),(size_t)__rhs);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff8d0);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(uVar1,in_stack_fffffffffffff908),(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffff908),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(uVar1,in_stack_fffffffffffff908),(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffff908),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      Application::offset_abi_cxx11_
                ((Application *)CONCAT17(uVar1,in_stack_fffffffffffff908),(size_t)__rhs);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     CONCAT17(uVar1,in_stack_fffffffffffff908),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      std::operator+(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0);
      std::__cxx11::string::operator+=((string *)(local_61 + 1),local_218);
      std::__cxx11::string::~string(local_218);
      std::__cxx11::string::~string(local_238);
      std::__cxx11::string::~string(local_3d8);
      std::__cxx11::string::~string(local_258);
      std::__cxx11::string::~string(local_278);
      std::__cxx11::string::~string(local_3b8);
      std::__cxx11::string::~string(local_298);
      std::__cxx11::string::~string(local_2b8);
      std::__cxx11::string::~string(local_398);
      std::__cxx11::string::~string(local_2d8);
      std::__cxx11::string::~string(local_2f8);
      std::__cxx11::string::~string(local_318);
      std::__cxx11::string::~string(local_338);
      std::__cxx11::string::~string(local_358);
      std::__cxx11::string::~string(local_378);
      std::__cxx11::string::~string((string *)(local_a1 + 1));
    }
  }
  std::operator+(in_stack_fffffffffffff8f8,
                 (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
  std::ofstream::ofstream(local_5d8,local_5f8,_S_out);
  std::__cxx11::string::~string(local_5f8);
  poVar2 = std::operator<<(local_5d8,"#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n");
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::operator<<(poVar2,"#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n");
  poVar2 = std::operator<<((ostream *)__lhs,"namespace lmfao\n{\n");
  poVar3 = std::operator<<(poVar2,local_28);
  std::operator<<(poVar3,"}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n");
  std::ofstream::close();
  std::operator+(in_stack_fffffffffffff8f8,
                 (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
  std::ofstream::open((string *)local_5d8,(_Ios_Openmode)local_618);
  std::__cxx11::string::~string(local_618);
  std::operator+((char *)in_RDI,__rhs_00);
  std::operator+(__lhs,(char *)poVar2);
  std::operator<<(local_5d8,local_638);
  std::__cxx11::string::~string(local_638);
  std::__cxx11::string::~string(local_658);
  std::ofstream::close();
  std::operator+(in_stack_fffffffffffff8f8,
                 (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
  std::ofstream::open((string *)local_5d8,(_Ios_Openmode)local_678);
  std::__cxx11::string::~string(local_678);
  dynamicFunctionsGenerator_abi_cxx11_(in_stack_00001c58);
  std::operator<<(local_5d8,local_698);
  std::__cxx11::string::~string(local_698);
  std::ofstream::close();
  std::operator+(in_stack_fffffffffffff8f8,
                 (char *)CONCAT17(in_stack_fffffffffffff8f7,in_stack_fffffffffffff8f0));
  std::ofstream::open((string *)local_5d8,(_Ios_Openmode)local_6b8);
  std::__cxx11::string::~string(local_6b8);
  dynamicFunctionsGenerator_abi_cxx11_(in_stack_00001c58);
  std::operator<<(local_5d8,local_6d8);
  std::__cxx11::string::~string(local_6d8);
  std::ofstream::close();
  std::ofstream::~ofstream(local_5d8);
  std::__cxx11::string::~string((string *)(local_61 + 1));
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void RegressionTree::genDynamicFunctions()
{
    std::string functionHeaders = "";
    std::string functionSource = "";
    for(size_t f = 0; f < NUM_OF_FUNCTIONS; ++f)
    {   
        if (_candidateMask[NUM_OF_VARIABLES].test(f))
        {
            Function* func = _compiler->getFunction(f);
            const var_bitset& fVars = func->_fVars;
            std::string fvarString = "";
            
            for (size_t var = 0; var < NUM_OF_VARIABLES; ++var)
            {
                if (fVars.test(var))
                {
                    Attribute* att = _td->getAttribute(var);
                    fvarString += typeToStr(att->_type)+" "+att->_name+",";
                }
            }
            fvarString.pop_back();
            functionHeaders += offset(1)+"double "+func->_name+"("+fvarString+");\n\n";
            functionSource += offset(1)+"double "+func->_name+"("+fvarString+")\n"+
                offset(1)+"{\n"+offset(2)+"return 1.0;\n"+offset(1)+"}\n";
        }
    }
    std::ofstream ofs(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.h", std::ofstream::out);
    ofs << "#ifndef INCLUDE_DYNAMICFUNCTIONS_H_\n"<<
        "#define INCLUDE_DYNAMICFUNCTIONS_H_\n\n"<<
        "namespace lmfao\n{\n"<< functionHeaders <<
        "}\n\n#endif /* INCLUDE_DYNAMICFUNCTIONS_H_*/\n";    
    ofs.close();
    
    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctions.cpp", std::ofstream::out);
    ofs << "#include \"DynamicFunctions.h\"\nnamespace lmfao\n{\n"+functionSource+"}\n";
    ofs.close();


    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"DynamicFunctionsGenerator.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();

    ofs.open(multifaq::dir::OUTPUT_DIRECTORY+"RegressionTreeHelper.hpp", std::ofstream::out);
    ofs << dynamicFunctionsGenerator();
    ofs.close();
}